

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  char *options_local;
  char **nargv_local;
  int nargc_local;
  
  iVar1 = getopt_internal(___argc,___argv,__shortopts,(option *)0x0,(int *)0x0,0);
  return iVar1;
}

Assistant:

int
getopt(int nargc, char * const * nargv, const char * options) {

	/*
	 * We don't pass FLAG_PERMUTE to getopt_internal() since
	 * the BSD getopt(3) (unlike GNU) has never done this.
	 *
	 * Furthermore, since many privileged programs call getopt()
	 * before dropping privileges it makes sense to keep things
	 * as simple (and bug-free) as possible.
	 */
	return (getopt_internal(nargc, nargv, options, NULL, NULL, 0));
}